

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_order_t * bov_order_update(bov_order_t *order,GLuint *elements,GLsizei n)

{
  GLsizei local_20;
  GLsizei n_local;
  GLuint *elements_local;
  bov_order_t *order_local;
  
  local_20 = n;
  if (elements == (GLuint *)0x0) {
    local_20 = 0;
  }
  order->eboLen = local_20;
  (*glad_glBindBuffer)(0x8893,order->ebo);
  if (order->eboCapacity < order->eboLen) {
    (*glad_glBufferData)(0x8893,(long)n << 2,elements,0x88e8);
    order->eboCapacity = order->eboLen;
  }
  else if (elements != (GLuint *)0x0) {
    (*glad_glBufferSubData)(0x8893,0,(long)n << 2,elements);
  }
  return order;
}

Assistant:

bov_order_t* bov_order_update(bov_order_t* order, const GLuint* elements, GLsizei n)
{
	order->eboLen = elements==NULL ? 0 : n;

	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	if(order->eboLen > order->eboCapacity) {
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(GLuint), elements,
		             GL_DYNAMIC_DRAW);
		order->eboCapacity = order->eboLen;
	}
	else if(elements!=NULL){
		glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, n * sizeof(GLuint), elements);
	}

	return order;
}